

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_get_record_field_type(coda_type *type,long index,coda_type **field_type)

{
  char *pcVar1;
  coda_type **field_type_local;
  long index_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xd26);
    type_local._4_4_ = -1;
  }
  else if (type->type_class == coda_record_class) {
    if (field_type == (coda_type **)0x0) {
      coda_set_error(-100,"field_type argument is NULL (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0xd31);
      type_local._4_4_ = -1;
    }
    else if ((index < 0) || ((long)type[1].name <= index)) {
      coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld) (%s:%u)",index,
                     type[1].name,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0xd38);
      type_local._4_4_ = -1;
    }
    else {
      *field_type = *(coda_type **)(*(long *)(type[1].description + index * 8) + 0x10);
      type_local._4_4_ = 0;
    }
  }
  else {
    pcVar1 = coda_type_get_class_name(type->type_class);
    coda_set_error(-0x69,"type does not refer to a record (current type is %s)",pcVar1);
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

LIBCODA_API int coda_type_get_record_field_type(const coda_type *type, long index, coda_type **field_type)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->type_class != coda_record_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "type does not refer to a record (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    if (field_type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field_type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (index < 0 || index >= ((coda_type_record *)type)->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld) (%s:%u)", index,
                       ((coda_type_record *)type)->num_fields, __FILE__, __LINE__);
        return -1;
    }
    *field_type = ((coda_type_record *)type)->field[index]->type;
    return 0;
}